

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ui4.cpp
# Opt level: O0

void __thiscall DomUI::setElementTabStops(DomUI *this,DomTabStops *a)

{
  QString *pQVar1;
  QString *in_RSI;
  DomTabStops *in_RDI;
  
  pQVar1 = in_RDI[8].m_tabStop.d.ptr;
  if (pQVar1 != (QString *)0x0) {
    DomTabStops::~DomTabStops(in_RDI);
    operator_delete(pQVar1,0x20);
  }
  *(uint *)&in_RDI[3].m_tabStop.d.ptr = *(uint *)&in_RDI[3].m_tabStop.d.ptr | 0x200;
  in_RDI[8].m_tabStop.d.ptr = in_RSI;
  return;
}

Assistant:

void DomUI::setElementTabStops(DomTabStops *a)
{
    delete m_tabStops;
    m_children |= TabStops;
    m_tabStops = a;
}